

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

void __thiscall
SemanticAnalyzerRun::onEnterLiteralExpressionAstNode
          (SemanticAnalyzerRun *this,LiteralExpressionAstNode *node)

{
  element_type *__str;
  
  __str = (node->token).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (__str->tokenType == FloatLiteral) {
    std::__cxx11::stod(&__str->value,(size_t *)0x0);
  }
  else if (__str->tokenType == IntegerLiteral) {
    std::__cxx11::stoll(&__str->value,(size_t *)0x0,10);
  }
  return;
}

Assistant:

void onEnterLiteralExpressionAstNode(LiteralExpressionAstNode* node) noexcept override {
    switch (node->token->tokenType) {
      case TokenType::IntegerLiteral: {
        try {
          std::stoll(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for integer literal.");
        }
      }
      case TokenType::FloatLiteral: {
        try {
          std::stod(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for float literal.");
        }
      }
      default:
        return;
    }
  }